

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

ostream * nlohmann::operator<<
                    (ostream *o,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                    *j)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)(o + *(long *)(*(long *)o + -0x18) + 0x10);
  lVar2 = lVar1;
  if (lVar1 < 1) {
    lVar2 = 0;
  }
  *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 0x10) = 0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::dump(j,o,0 < lVar1,(uint)lVar2,0);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const basic_json& j)
        {
            // read width member and use it as indentation parameter if nonzero
            const bool pretty_print = (o.width() > 0);
            const auto indentation = (pretty_print ? o.width() : 0);

            // reset width to 0 for subsequent calls to this stream
            o.width(0);

            // do the actual serialization
            j.dump(o, pretty_print, static_cast<unsigned int>(indentation));
            return o;
        }